

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FileDescriptor *file,
          Options *options)

{
  size_t sVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 *puVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  FileDescriptor *in_R8;
  AlphaNum *in_R9;
  int iVar10;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  string_view name;
  string_view classname;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  string_view name_00;
  string_view classname_00;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string segment;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  AlphaNum local_148;
  string result;
  string_view proto_file;
  string local_e0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  proto_file._M_str = (char *)**(undefined8 **)(this + 8);
  proto_file._M_len = (*(undefined8 **)(this + 8))[1];
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find(&proto_file,'/',0);
  iVar9 = (int)sVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"",(allocator<char> *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&segment,"",(allocator<char> *)&local_148);
  bVar11._M_str = proto_file._M_str;
  bVar11._M_len = proto_file._M_len;
  __y._M_str = "google/protobuf/empty.proto";
  __y._M_len = 0x1b;
  bVar2 = std::operator==(bVar11,__y);
  if (bVar2) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&kEmptyMetadataFile,(allocator<char> *)&local_148);
  }
  else if ((file->super_SymbolBase).symbol_type_ == '\x01') {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&kDescriptorMetadataFile,
               (allocator<char> *)&local_148);
  }
  else {
    local_158 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                      (&proto_file,'.',0xffffffffffffffff);
    __x._M_str = proto_file._M_str;
    __x._M_len = proto_file._M_len;
    __y_00._M_str = "google/protobuf/empty.proto";
    __y_00._M_len = 0x1b;
    pcVar6 = "google/protobuf/empty.proto";
    bVar2 = std::operator==(__x,__y_00);
    if (bVar2) {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,&kEmptyMetadataFile,(allocator<char> *)&local_148)
      ;
    }
    else {
      local_158 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            (&proto_file,0,(long)(int)sVar4);
      if ((*(byte *)(*(long *)(this + 0x80) + 0x29) & 1) == 0) {
        local_148.piece_ = absl::lts_20250127::NullSafeStringView("GPBMetadata/");
        absl::lts_20250127::StrAppend(&result,&local_148);
        iVar9 = 0;
        while (iVar10 = (int)sVar3, iVar10 != -1) {
          bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (&local_158,(long)iVar9,(long)(iVar10 - iVar9));
          name._M_len = bVar11._M_str;
          name._M_str = pcVar6;
          UnderscoresToCamelCase_abi_cxx11_
                    ((string *)&local_148,(_anonymous_namespace_ *)bVar11._M_len,name,SUB81(in_R8,0)
                    );
          std::__cxx11::string::operator=((string *)&segment,(string *)&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          classname._M_str = (char *)this;
          classname._M_len = (size_t)segment._M_dataplus._M_p;
          ReservedNamePrefix_abi_cxx11_
                    ((string *)&local_c0,(php *)segment._M_string_length,classname,in_R8);
          local_148.piece_._M_str = (char *)local_c0.piece_._M_len;
          local_148.piece_._M_len = (size_t)local_c0.piece_._M_str;
          local_90.piece_._M_len = segment._M_string_length;
          local_90.piece_._M_str = segment._M_dataplus._M_p;
          local_60.piece_ = absl::lts_20250127::NullSafeStringView("/");
          pcVar6 = (char *)&local_60;
          absl::lts_20250127::StrAppend(&result,&local_148,&local_90,(AlphaNum *)pcVar6);
          std::__cxx11::string::~string((string *)&local_c0);
          iVar9 = iVar10 + 1;
          sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            (&local_158,'/',(long)iVar9);
        }
        iVar9 = -1;
      }
      else {
        puVar5 = (undefined8 *)(*(ulong *)(*(long *)(this + 0x80) + 0x88) & 0xfffffffffffffffc);
        sVar1 = puVar5[1];
        if (sVar1 != 0) {
          pcVar6 = (char *)*puVar5;
          __y_01._M_str = "\\";
          __y_01._M_len = 1;
          __x_00._M_str = pcVar6;
          __x_00._M_len = sVar1;
          bVar2 = std::operator!=(__x_00,__y_01);
          if (bVar2) {
            local_148.piece_._M_str = pcVar6;
            local_148.piece_._M_len = sVar1;
            absl::lts_20250127::StrAppend(&result,&local_148);
            local_148.piece_._M_len._0_1_ = 0x5c;
            local_90.piece_._M_len = CONCAT71(local_90.piece_._M_len._1_7_,0x2f);
            std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )result._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(result._M_dataplus._M_p + result._M_string_length),(char *)&local_148,
                       (char *)&local_90);
            pcVar6 = (char *)std::__cxx11::string::at((ulong)&result);
            if (*pcVar6 != '/') {
              local_148.piece_ = absl::lts_20250127::NullSafeStringView("/");
              absl::lts_20250127::StrAppend(&result,&local_148);
            }
          }
        }
      }
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                        (&local_158,'/',0xffffffffffffffff);
      uVar7 = (int)sVar3 + 1;
      pcVar6 = (char *)(ulong)uVar7;
      uVar8 = 0;
      if ((int)sVar3 != -1) {
        uVar8 = uVar7;
      }
      bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_158,(long)(int)uVar8,(long)(int)(iVar9 - uVar8));
      name_00._M_len = bVar11._M_str;
      name_00._M_str = pcVar6;
      UnderscoresToCamelCase_abi_cxx11_
                ((string *)&local_148,(_anonymous_namespace_ *)bVar11._M_len,name_00,SUB81(in_R8,0))
      ;
      std::__cxx11::string::operator=((string *)&segment,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      classname_00._M_str = (char *)this;
      classname_00._M_len = (size_t)segment._M_dataplus._M_p;
      ReservedNamePrefix_abi_cxx11_(&local_e0,(php *)segment._M_string_length,classname_00,in_R8);
      local_90.piece_._M_len = local_e0._M_string_length;
      local_90.piece_._M_str = local_e0._M_dataplus._M_p;
      local_c0.piece_ = absl::lts_20250127::NullSafeStringView(".php");
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)&local_148,&local_90,&local_60,&local_c0,
                 in_R9);
      std::__cxx11::string::~string((string *)&local_e0);
    }
  }
  std::__cxx11::string::~string((string *)&segment);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedMetadataFileName(const FileDescriptor* file,
                                      const Options& options) {
  absl::string_view proto_file = file->name();
  int start_index = 0;
  int first_index = proto_file.find_first_of('/', start_index);
  std::string result = "";
  std::string segment = "";

  if (proto_file == kEmptyFile) {
    return std::string(kEmptyMetadataFile);
  }
  if (options.is_descriptor) {
    return std::string(kDescriptorMetadataFile);
  }

  // Append directory name.
  absl::string_view file_no_suffix;
  int lastindex = proto_file.find_last_of('.');
  if (proto_file == kEmptyFile) {
    return std::string(kEmptyMetadataFile);
  } else {
    file_no_suffix = proto_file.substr(0, lastindex);
  }

  if (file->options().has_php_metadata_namespace()) {
    absl::string_view php_metadata_namespace =
        file->options().php_metadata_namespace();
    if (!php_metadata_namespace.empty() && php_metadata_namespace != "\\") {
      absl::StrAppend(&result, php_metadata_namespace);
      std::replace(result.begin(), result.end(), '\\', '/');
      if (result.at(result.size() - 1) != '/') {
        absl::StrAppend(&result, "/");
      }
    }
  } else {
    absl::StrAppend(&result, "GPBMetadata/");
    while (first_index != std::string::npos) {
      segment = UnderscoresToCamelCase(
          file_no_suffix.substr(start_index, first_index - start_index), true);
      absl::StrAppend(&result, ReservedNamePrefix(segment, file), segment, "/");
      start_index = first_index + 1;
      first_index = file_no_suffix.find_first_of('/', start_index);
    }
  }

  // Append file name.
  int file_name_start = file_no_suffix.find_last_of('/');
  if (file_name_start == std::string::npos) {
    file_name_start = 0;
  } else {
    file_name_start += 1;
  }
  segment = UnderscoresToCamelCase(
      file_no_suffix.substr(file_name_start, first_index - file_name_start),
      true);

  return absl::StrCat(result, ReservedNamePrefix(segment, file), segment,
                      ".php");
}